

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O2

Const * __thiscall MixedArena::alloc<wasm::Const>(MixedArena *this)

{
  Const *pCVar1;
  
  pCVar1 = (Const *)allocSpace(this,0x28,8);
  (pCVar1->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression._id = ConstId;
  (pCVar1->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression.type.id = 0;
  (pCVar1->value).field_0.i64 = 0;
  (pCVar1->value).field_0.func.super_IString.str._M_str = (char *)0x0;
  (pCVar1->value).type.id = 0;
  return pCVar1;
}

Assistant:

T* alloc() {
    static_assert(alignof(T) <= MAX_ALIGN,
                  "maximum alignment not large enough");
    auto* ret = static_cast<T*>(allocSpace(sizeof(T), alignof(T)));
    new (ret) T(*this); // allocated objects receive the allocator, so they can
                        // allocate more later if necessary
    return ret;
  }